

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_quaddrawer.cpp
# Opt level: O0

void __thiscall FQuadDrawer::DoRender(FQuadDrawer *this,int type)

{
  FShader *pFVar1;
  FShader *shader;
  GLfloat local_98;
  int i;
  float matT [16];
  float matV [16];
  int type_local;
  FQuadDrawer *this_local;
  
  for (shader._4_4_ = 0; shader._4_4_ < 4; shader._4_4_ = shader._4_4_ + 1) {
    matT[(long)(shader._4_4_ << 2) + 0xe] = buffer[shader._4_4_].x;
    matT[(long)(shader._4_4_ * 4 + 1) + 0xe] = buffer[shader._4_4_].z;
    matT[(long)(shader._4_4_ * 4 + 2) + 0xe] = buffer[shader._4_4_].y;
    matT[(long)(shader._4_4_ * 4 + 3) + 0xe] = 1.0;
    (&local_98)[shader._4_4_ << 2] = buffer[shader._4_4_].u;
    (&local_98)[shader._4_4_ * 4 + 1] = buffer[shader._4_4_].v;
    (&local_98)[shader._4_4_ * 4 + 3] = 0.0;
    (&local_98)[shader._4_4_ * 4 + 2] = 0.0;
  }
  pFVar1 = FShaderManager::GetActiveShader(GLRenderer->mShaderManager);
  (*_ptrc_glUniformMatrix4fv)(pFVar1->vertexmatrix_index,1,'\0',matT + 0xe);
  (*_ptrc_glUniformMatrix4fv)(pFVar1->texcoordmatrix_index,1,'\0',&local_98);
  (*_ptrc_glUniform1i)(pFVar1->quadmode_index,1);
  FFlatVertexBuffer::RenderArray(GLRenderer->mVBO,type,0,4);
  (*_ptrc_glUniform1i)(pFVar1->quadmode_index,0);
  return;
}

Assistant:

void FQuadDrawer::DoRender(int type)
{
	// When this gets called, the render state must already be applied so we can just
	// send our vertices to the current shader.
	float matV[16], matT[16];
	
	for(int i=0;i<4;i++)
	{
		matV[i*4+0] = buffer[i].x;
		matV[i*4+1] = buffer[i].z;
		matV[i*4+2] = buffer[i].y;
		matV[i*4+3] = 1;
		matT[i*4+0] = buffer[i].u;
		matT[i*4+1] = buffer[i].v;
		matT[i*4+2] = matT[i*4+3] = 0;
	}
	FShader *shader = GLRenderer->mShaderManager->GetActiveShader();
	glUniformMatrix4fv(shader->vertexmatrix_index, 1, false, matV);
	glUniformMatrix4fv(shader->texcoordmatrix_index, 1, false, matT);
	glUniform1i(shader->quadmode_index, 1);
	GLRenderer->mVBO->RenderArray(type, FFlatVertexBuffer::QUAD_INDEX, 4);
	glUniform1i(shader->quadmode_index, 0);
}